

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::WriteData(CWriter *this,char *src,size_t size)

{
  ulong size_00;
  
  if (this->should_write_indent_next_ == true) {
    for (size_00 = (ulong)this->indent_; 0x8d < size_00; size_00 = size_00 - 0x8e) {
      Stream::WriteData(this->stream_,(anonymous_namespace)::CWriter::WriteIndent()::s_indent,0x8e,
                        (char *)0x0,No);
    }
    if (size_00 != 0) {
      Stream::WriteData(this->stream_,(anonymous_namespace)::CWriter::WriteIndent()::s_indent,
                        size_00,(char *)0x0,No);
    }
    this->should_write_indent_next_ = false;
  }
  if ((size != 0) && (*src != '\n')) {
    this->consecutive_newline_count_ = 0;
  }
  Stream::WriteData(this->stream_,src,size,(char *)0x0,No);
  return;
}

Assistant:

void CWriter::WriteData(const char* src, size_t size) {
  if (should_write_indent_next_) {
    WriteIndent();
    should_write_indent_next_ = false;
  }
  if (size > 0 && src[0] != '\n') {
    consecutive_newline_count_ = 0;
  }
  stream_->WriteData(src, size);
}